

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetAccessors
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *getter,Var *setter)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  PropertyRecord *pPVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  ArrayObject *pAVar7;
  Var pvVar8;
  _func_int **pp_Var9;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  Var *local_40;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)setter;
  local_40 = getter;
  if (getter == (Var *)0x0 || setter == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x622,"(nullptr != getter && nullptr != setter)",
                                "Getter/Setter must be a valid pointer");
    if (!bVar4) goto LAB_00c291d4;
    *puVar6 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x624,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
LAB_00c291d4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  local_50 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_50,&local_38);
  if (bVar4) {
    if ((local_38->Attributes & 8) != 0) {
      return 0;
    }
    iVar5 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(local_38);
    if (iVar5 == -1) {
      iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(local_38);
      bVar4 = iVar5 != -1;
      if (bVar4) {
        iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(local_38);
        pvVar8 = DynamicObject::GetSlot(instance,iVar5);
        *local_40 = pvVar8;
        (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
      }
      pPVar3 = propertyRecord;
      iVar5 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(local_38);
      if (iVar5 != -1) {
        iVar5 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(local_38);
        pp_Var9 = (_func_int **)DynamicObject::GetSlot(instance,iVar5);
        (pPVar3->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
             = pp_Var9;
        bVar2 = !bVar4;
        bVar4 = true;
        if (bVar2) {
          *local_40 = (Var)0x0;
        }
      }
      return (uint)bVar4;
    }
  }
  iVar5 = 0;
  if ((local_50->isNumeric == true) &&
     (pAVar7 = DynamicObject::GetObjectArray(instance), iVar5 = 0, pAVar7 != (ArrayObject *)0x0)) {
    iVar5 = (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x15])
                      (pAVar7,(ulong)(uint)propertyId,local_40,propertyRecord,this_00);
  }
  return iVar5;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        AssertMsg(nullptr != getter && nullptr != setter, "Getter/Setter must be a valid pointer");

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (descriptor->template GetDataPropertyIndex<false>() == NoSlots)
            {
                bool getset = false;
                if (descriptor->GetGetterPropertyIndex() != NoSlots)
                {
                    *getter = instance->GetSlot(descriptor->GetGetterPropertyIndex());
                    *setter = nullptr;
                    getset = true;
                }
                if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    *setter = instance->GetSlot(descriptor->GetSetterPropertyIndex());
                    if(!getset) {
                        // if we didn't set the getter above, we need to set it here
                        *getter = nullptr;
                    }
                    getset = true;
                }
                return getset;
            }
        }

        // Check numeric propertyRecord only if objectArray available
        if (propertyRecord->IsNumeric())
        {
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray != nullptr)
            {
                return objectArray->GetAccessors(propertyId, getter, setter, scriptContext);
            }
        }

        return false;
    }